

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueIntCase::test(UniformValueIntCase *this)

{
  CallLogWrapper *this_00;
  RenderContext *renderCtx;
  GLint location;
  GLint GVar1;
  undefined8 in_R8;
  GLint y;
  undefined8 in_R9;
  long lVar2;
  ShaderProgram program;
  ProgramSources sources;
  GLint w;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  value_type local_1f0;
  ShaderProgram local_1d0;
  ProgramSources local_100;
  
  renderCtx = ((this->super_ApiCase).super_TestCase.m_context)->m_renderCtx;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "uniform highp int intUniform;\nuniform highp ivec2 int2Uniform;\nuniform highp ivec3 int3Uniform;\nuniform highp ivec4 int4Uniform;\nvoid main (void)\n{\n\tgl_Position = vec4(float(intUniform + int2Uniform.x + int3Uniform.x + int4Uniform.x));\n}\n"
             ,"");
  _Var3._M_p = (pointer)&local_200;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffdf0,
             "void main (void)\n{\n\tgl_FragColor = vec4(0.0);\n}\n","");
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,(value_type *)&stack0xfffffffffffffdf0);
  glu::ShaderProgram::ShaderProgram(&local_1d0,renderCtx,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar2 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar2));
    y = (GLint)in_R9;
    GVar1 = (GLint)in_R8;
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_200) {
    operator_delete(_Var3._M_p,local_200._M_allocated_capacity + 1);
  }
  w = (GLint)_Var3._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0.m_program.m_info.linkOk == false) {
    glu::operator<<((this->super_ApiCase).m_log,&local_1d0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  else {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    glu::CallLogWrapper::glUseProgram(this_00,local_1d0.m_program.m_program);
    ApiCase::expectError(&this->super_ApiCase,0);
    location = glu::CallLogWrapper::glGetUniformLocation
                         (this_00,local_1d0.m_program.m_program,"intUniform");
    glu::CallLogWrapper::glUniform1i(this_00,location,1);
    verifyUniformValue1i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,location,GVar1);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"int2Uniform");
    glu::CallLogWrapper::glUniform2i(this_00,GVar1,1,2);
    verifyUniformValue2i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar1,2,y);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"int3Uniform");
    glu::CallLogWrapper::glUniform3i(this_00,GVar1,1,2,3);
    verifyUniformValue3i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar1,1,2,3);
    GVar1 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,local_1d0.m_program.m_program,"int4Uniform");
    glu::CallLogWrapper::glUniform4i(this_00,GVar1,1,2,3,4);
    verifyUniformValue4i
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               local_1d0.m_program.m_program,GVar1,2,3,4,w);
    glu::CallLogWrapper::glUseProgram(this_00,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  glu::ShaderProgram::~ShaderProgram(&local_1d0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"uniform highp int intUniform;\n"
			"uniform highp ivec2 int2Uniform;\n"
			"uniform highp ivec3 int3Uniform;\n"
			"uniform highp ivec4 int4Uniform;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(float(intUniform + int2Uniform.x + int3Uniform.x + int4Uniform.x));\n"
			"}\n";
		static const char* testFragSource =
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program.getProgram(), "intUniform");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		location = glGetUniformLocation(program.getProgram(), "int2Uniform");
		glUniform2i(location, 1, 2);
		verifyUniformValue2i(m_testCtx, *this, program.getProgram(), location, 1, 2);

		location = glGetUniformLocation(program.getProgram(), "int3Uniform");
		glUniform3i(location, 1, 2, 3);
		verifyUniformValue3i(m_testCtx, *this, program.getProgram(), location, 1, 2, 3);

		location = glGetUniformLocation(program.getProgram(), "int4Uniform");
		glUniform4i(location, 1, 2, 3, 4);
		verifyUniformValue4i(m_testCtx, *this, program.getProgram(), location, 1, 2, 3, 4);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}